

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_> *
ExprEval::Operator::get_spec_table(void)

{
  time_t tVar1;
  vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
  *this;
  value_type local_1428 [2];
  undefined1 local_1420 [8];
  Specification spec_shiftr;
  undefined1 local_1398 [8];
  Specification spec_shiftl;
  undefined1 local_1310 [8];
  Specification spec_xor;
  undefined1 local_1288 [8];
  Specification spec_not;
  undefined1 local_1200 [8];
  Specification spec_or;
  undefined1 local_1178 [8];
  Specification spec_and;
  Specification spec_false;
  Specification spec_true;
  Specification spec_e;
  Specification spec_pi;
  undefined1 local_ef0 [8];
  Specification spec_rand;
  undefined1 local_e68 [8];
  Specification spec_gamma;
  undefined1 local_de0 [8];
  Specification spec_abs;
  undefined1 local_d58 [8];
  Specification spec_ceil;
  undefined1 local_cd0 [8];
  Specification spec_floor;
  undefined1 local_c48 [8];
  Specification spec_round;
  undefined1 local_bc0 [8];
  Specification spec_atanh;
  undefined1 local_b38 [8];
  Specification spec_acosh;
  undefined1 local_ab0 [8];
  Specification spec_asinh;
  undefined1 local_a28 [8];
  Specification spec_atan;
  undefined1 local_9a0 [8];
  Specification spec_acos;
  undefined1 local_918 [8];
  Specification spec_asin;
  undefined1 local_890 [8];
  Specification spec_tanh;
  undefined1 local_808 [8];
  Specification spec_cosh;
  undefined1 local_780 [8];
  Specification spec_sinh;
  undefined1 local_6f8 [8];
  Specification spec_cot;
  undefined1 local_670 [8];
  Specification spec_tan;
  undefined1 local_5e8 [8];
  Specification spec_cos;
  undefined1 local_560 [8];
  Specification spec_sin;
  undefined1 local_4d8 [8];
  Specification spec_log10;
  undefined1 local_450 [8];
  Specification spec_log2;
  undefined1 local_3c8 [8];
  Specification spec_ln;
  undefined1 local_340 [8];
  Specification spec_mod;
  undefined1 local_2b8 [8];
  Specification spec_pow;
  undefined1 local_230 [8];
  Specification spec_divide;
  undefined1 local_1a8 [8];
  Specification spec_multiply;
  undefined1 local_120 [8];
  Specification spec_subtract;
  value_type local_98 [4];
  undefined1 local_88 [8];
  Specification spec_add;
  
  if (specification_table ==
      (vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
       *)0x0) {
    tVar1 = time((time_t *)0x0);
    srand((uint)tVar1);
    this = (vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
            *)operator_new(0x18);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    vector(this);
    specification_table = this;
    Specification::Specification((Specification *)local_88);
    std::__cxx11::string::operator=((string *)&spec_add,"+");
    spec_add.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 9;
    spec_add._32_8_ = 2;
    local_98[0] = -1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_add.n_arg,local_98);
    spec_subtract._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_add.n_arg,
               (value_type *)&spec_subtract.field_0x7c);
    Specification::Specification((Specification *)local_120);
    std::__cxx11::string::operator=((string *)&spec_subtract,"-");
    spec_subtract.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 9;
    spec_subtract._32_8_ = 2;
    spec_multiply._124_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_subtract.n_arg,
               (value_type *)&spec_multiply.field_0x7c);
    spec_multiply.priority = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_subtract.n_arg,&spec_multiply.priority);
    Specification::Specification((Specification *)local_1a8);
    std::__cxx11::string::operator=((string *)&spec_multiply,"*");
    spec_multiply.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 8;
    spec_multiply._32_8_ = 2;
    spec_divide._124_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_multiply.n_arg,
               (value_type *)&spec_divide.field_0x7c);
    spec_divide.priority = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_multiply.n_arg,&spec_divide.priority);
    Specification::Specification((Specification *)local_230);
    std::__cxx11::string::operator=((string *)&spec_divide,"/");
    spec_divide.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 8;
    spec_divide._32_8_ = 2;
    spec_pow._124_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_divide.n_arg,
               (value_type *)&spec_pow.field_0x7c);
    spec_pow.priority = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_divide.n_arg,&spec_pow.priority);
    Specification::Specification((Specification *)local_2b8);
    std::__cxx11::string::operator=((string *)&spec_pow,"^");
    spec_pow.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 7;
    spec_pow._32_8_ = 2;
    spec_mod._124_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_pow.n_arg,
               (value_type *)&spec_mod.field_0x7c);
    spec_mod.priority = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_pow.n_arg,&spec_mod.priority);
    Specification::Specification((Specification *)local_340);
    std::__cxx11::string::operator=((string *)&spec_mod,"mod");
    spec_mod.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 7;
    spec_mod._32_8_ = 2;
    spec_ln._124_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_mod.n_arg,
               (value_type *)&spec_ln.field_0x7c);
    spec_ln.priority = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_mod.n_arg,&spec_ln.priority);
    Specification::Specification((Specification *)local_3c8);
    std::__cxx11::string::operator=((string *)&spec_ln,"ln");
    spec_ln.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_ln._32_8_ = 1;
    spec_log2._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_ln.n_arg,
               (value_type *)&spec_log2.field_0x7c);
    Specification::Specification((Specification *)local_450);
    std::__cxx11::string::operator=((string *)&spec_log2,"log2");
    spec_log2.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_log2._32_8_ = 1;
    spec_log10._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_log2.n_arg,
               (value_type *)&spec_log10.field_0x7c);
    Specification::Specification((Specification *)local_4d8);
    std::__cxx11::string::operator=((string *)&spec_log10,"log");
    spec_log10.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_log10._32_8_ = 1;
    spec_sin._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_log10.n_arg,
               (value_type *)&spec_sin.field_0x7c);
    Specification::Specification((Specification *)local_560);
    std::__cxx11::string::operator=((string *)&spec_sin,"sin");
    spec_sin.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_sin._32_8_ = 1;
    spec_cos._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_sin.n_arg,
               (value_type *)&spec_cos.field_0x7c);
    Specification::Specification((Specification *)local_5e8);
    std::__cxx11::string::operator=((string *)&spec_cos,"cos");
    spec_cos.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_cos._32_8_ = 1;
    spec_tan._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_cos.n_arg,
               (value_type *)&spec_tan.field_0x7c);
    Specification::Specification((Specification *)local_670);
    std::__cxx11::string::operator=((string *)&spec_tan,"tan");
    spec_tan.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_tan._32_8_ = 1;
    spec_cot._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_tan.n_arg,
               (value_type *)&spec_cot.field_0x7c);
    Specification::Specification((Specification *)local_6f8);
    std::__cxx11::string::operator=((string *)&spec_cot,"cot");
    spec_cot.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_cot._32_8_ = 1;
    spec_sinh._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_cot.n_arg,
               (value_type *)&spec_sinh.field_0x7c);
    Specification::Specification((Specification *)local_780);
    std::__cxx11::string::operator=((string *)&spec_sinh,"sinh");
    spec_sinh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_sinh._32_8_ = 1;
    spec_cosh._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_sinh.n_arg,
               (value_type *)&spec_cosh.field_0x7c);
    Specification::Specification((Specification *)local_808);
    std::__cxx11::string::operator=((string *)&spec_cosh,"cosh");
    spec_cosh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_cosh._32_8_ = 1;
    spec_tanh._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_cosh.n_arg,
               (value_type *)&spec_tanh.field_0x7c);
    Specification::Specification((Specification *)local_890);
    std::__cxx11::string::operator=((string *)&spec_tanh,"tanh");
    spec_tanh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_tanh._32_8_ = 1;
    spec_asin._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_tanh.n_arg,
               (value_type *)&spec_asin.field_0x7c);
    Specification::Specification((Specification *)local_918);
    std::__cxx11::string::operator=((string *)&spec_asin,"arcsin");
    spec_asin.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_asin._32_8_ = 1;
    spec_acos._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_asin.n_arg,
               (value_type *)&spec_acos.field_0x7c);
    Specification::Specification((Specification *)local_9a0);
    std::__cxx11::string::operator=((string *)&spec_acos,"arccos");
    spec_acos.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_acos._32_8_ = 1;
    spec_atan._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_acos.n_arg,
               (value_type *)&spec_atan.field_0x7c);
    Specification::Specification((Specification *)local_a28);
    std::__cxx11::string::operator=((string *)&spec_atan,"arctan");
    spec_atan.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_atan._32_8_ = 1;
    spec_asinh._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_atan.n_arg,
               (value_type *)&spec_asinh.field_0x7c);
    Specification::Specification((Specification *)local_ab0);
    std::__cxx11::string::operator=((string *)&spec_asinh,"arcsinh");
    spec_asinh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_asinh._32_8_ = 1;
    spec_acosh._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_asinh.n_arg,
               (value_type *)&spec_acosh.field_0x7c);
    Specification::Specification((Specification *)local_b38);
    std::__cxx11::string::operator=((string *)&spec_acosh,"arccosh");
    spec_acosh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_acosh._32_8_ = 1;
    spec_atanh._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_acosh.n_arg,
               (value_type *)&spec_atanh.field_0x7c);
    Specification::Specification((Specification *)local_bc0);
    std::__cxx11::string::operator=((string *)&spec_atanh,"arctanh");
    spec_atanh.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_atanh._32_8_ = 1;
    spec_round._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_atanh.n_arg,
               (value_type *)&spec_round.field_0x7c);
    Specification::Specification((Specification *)local_c48);
    std::__cxx11::string::operator=((string *)&spec_round,"round");
    spec_round.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_round._32_8_ = 1;
    spec_floor._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_round.n_arg,
               (value_type *)&spec_floor.field_0x7c);
    Specification::Specification((Specification *)local_cd0);
    std::__cxx11::string::operator=((string *)&spec_floor,"floor");
    spec_floor.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_floor._32_8_ = 1;
    spec_ceil._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_floor.n_arg,
               (value_type *)&spec_ceil.field_0x7c);
    Specification::Specification((Specification *)local_d58);
    std::__cxx11::string::operator=((string *)&spec_ceil,"ceil");
    spec_ceil.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_ceil._32_8_ = 1;
    spec_abs._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_ceil.n_arg,
               (value_type *)&spec_abs.field_0x7c);
    Specification::Specification((Specification *)local_de0);
    std::__cxx11::string::operator=((string *)&spec_abs,"abs");
    spec_abs.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_abs._32_8_ = 1;
    spec_gamma._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_abs.n_arg,
               (value_type *)&spec_gamma.field_0x7c);
    Specification::Specification((Specification *)local_e68);
    std::__cxx11::string::operator=((string *)&spec_gamma,"gamma");
    spec_gamma.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_gamma._32_8_ = 1;
    spec_rand._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_gamma.n_arg,
               (value_type *)&spec_rand.field_0x7c);
    Specification::Specification((Specification *)local_ef0);
    std::__cxx11::string::operator=((string *)&spec_rand,"rand");
    spec_rand.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_rand._32_8_ = 0;
    spec_pi._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_rand.n_arg,
               (value_type *)&spec_pi.field_0x7c);
    Specification::Specification((Specification *)&spec_e.priority);
    std::__cxx11::string::operator=((string *)&spec_pi,"pi");
    spec_pi.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 5;
    spec_pi._32_8_ = 0;
    Specification::Specification((Specification *)&spec_true.priority);
    std::__cxx11::string::operator=((string *)&spec_e,"e");
    spec_e.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 5;
    spec_e._32_8_ = 0;
    Specification::Specification((Specification *)&spec_false.priority);
    std::__cxx11::string::operator=((string *)&spec_true,"T");
    spec_true.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 5;
    spec_true._32_8_ = 0;
    Specification::Specification((Specification *)&spec_and.priority);
    std::__cxx11::string::operator=((string *)&spec_false,"F");
    spec_false.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 5;
    spec_false._32_8_ = 0;
    Specification::Specification((Specification *)local_1178);
    std::__cxx11::string::operator=((string *)&spec_and,"and");
    spec_and.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_and._32_8_ = 2;
    spec_or._124_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_and.n_arg,
               (value_type *)&spec_or.field_0x7c);
    spec_or.priority = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_and.n_arg,&spec_or.priority);
    Specification::Specification((Specification *)local_1200);
    std::__cxx11::string::operator=((string *)&spec_or,"or");
    spec_or.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_or._32_8_ = 2;
    spec_not._124_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_or.n_arg,
               (value_type *)&spec_not.field_0x7c);
    spec_not.priority = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_or.n_arg,&spec_not.priority);
    Specification::Specification((Specification *)local_1288);
    std::__cxx11::string::operator=((string *)&spec_not,"not");
    spec_not.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_not._32_8_ = 1;
    spec_xor._124_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_not.n_arg,
               (value_type *)&spec_xor.field_0x7c);
    Specification::Specification((Specification *)local_1310);
    std::__cxx11::string::operator=((string *)&spec_xor,"xor");
    spec_xor.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_xor._32_8_ = 2;
    spec_shiftl._124_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_xor.n_arg,
               (value_type *)&spec_shiftl.field_0x7c);
    spec_shiftl.priority = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_xor.n_arg,&spec_shiftl.priority);
    Specification::Specification((Specification *)local_1398);
    std::__cxx11::string::operator=((string *)&spec_shiftl,"shiftl");
    spec_shiftl.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_shiftl._32_8_ = 2;
    spec_shiftr._124_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_shiftl.n_arg,
               (value_type *)&spec_shiftr.field_0x7c);
    spec_shiftr.priority = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_shiftl.n_arg,&spec_shiftr.priority);
    Specification::Specification((Specification *)local_1420);
    std::__cxx11::string::operator=((string *)&spec_shiftr,"shiftr");
    spec_shiftr.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
    spec_shiftr._32_8_ = 2;
    local_1428[1] = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_shiftr.n_arg,local_1428 + 1);
    local_1428[0] = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&spec_shiftr.n_arg,local_1428);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_88);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_120);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_1a8);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_230);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_2b8);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_340);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_3c8);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_450);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_4d8);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_560);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_5e8);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_670);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_6f8);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_780);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_808);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_890);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_918);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_9a0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_a28);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_ab0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_b38);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_bc0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_c48);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_cd0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_d58);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_de0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_e68);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_ef0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)&spec_e.priority);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)&spec_true.priority);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)&spec_false.priority);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)&spec_and.priority);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_1178);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_1200);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_1288);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_1310);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_1398);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,(value_type *)local_1420);
    Specification::~Specification((Specification *)local_1420);
    Specification::~Specification((Specification *)local_1398);
    Specification::~Specification((Specification *)local_1310);
    Specification::~Specification((Specification *)local_1288);
    Specification::~Specification((Specification *)local_1200);
    Specification::~Specification((Specification *)local_1178);
    Specification::~Specification((Specification *)&spec_and.priority);
    Specification::~Specification((Specification *)&spec_false.priority);
    Specification::~Specification((Specification *)&spec_true.priority);
    Specification::~Specification((Specification *)&spec_e.priority);
    Specification::~Specification((Specification *)local_ef0);
    Specification::~Specification((Specification *)local_e68);
    Specification::~Specification((Specification *)local_de0);
    Specification::~Specification((Specification *)local_d58);
    Specification::~Specification((Specification *)local_cd0);
    Specification::~Specification((Specification *)local_c48);
    Specification::~Specification((Specification *)local_bc0);
    Specification::~Specification((Specification *)local_b38);
    Specification::~Specification((Specification *)local_ab0);
    Specification::~Specification((Specification *)local_a28);
    Specification::~Specification((Specification *)local_9a0);
    Specification::~Specification((Specification *)local_918);
    Specification::~Specification((Specification *)local_890);
    Specification::~Specification((Specification *)local_808);
    Specification::~Specification((Specification *)local_780);
    Specification::~Specification((Specification *)local_6f8);
    Specification::~Specification((Specification *)local_670);
    Specification::~Specification((Specification *)local_5e8);
    Specification::~Specification((Specification *)local_560);
    Specification::~Specification((Specification *)local_4d8);
    Specification::~Specification((Specification *)local_450);
    Specification::~Specification((Specification *)local_3c8);
    Specification::~Specification((Specification *)local_340);
    Specification::~Specification((Specification *)local_2b8);
    Specification::~Specification((Specification *)local_230);
    Specification::~Specification((Specification *)local_1a8);
    Specification::~Specification((Specification *)local_120);
    Specification::~Specification((Specification *)local_88);
  }
  return specification_table;
}

Assistant:

const std::vector<Operator::Specification>* get_spec_table(){
            if(!specification_table){
                srand(time(0));
                specification_table = new std::vector<Operator::Specification>;

                Operator::Specification spec_add;
                spec_add.symbol = "+";
                spec_add.priority = 9;
                spec_add.n_arg = 2;
                spec_add.arg_positions.push_back(-1);
                spec_add.arg_positions.push_back(1);

                Operator::Specification spec_subtract;
                spec_subtract.symbol = "-";
                spec_subtract.priority = 9;
                spec_subtract.n_arg = 2;
                spec_subtract.arg_positions.push_back(-1);
                spec_subtract.arg_positions.push_back(1);

                Operator::Specification spec_multiply;
                spec_multiply.symbol = "*";
                spec_multiply.priority = 8;
                spec_multiply.n_arg = 2;
                spec_multiply.arg_positions.push_back(-1);
                spec_multiply.arg_positions.push_back(1);

                Operator::Specification spec_divide;
                spec_divide.symbol = "/";
                spec_divide.priority = 8;
                spec_divide.n_arg = 2;
                spec_divide.arg_positions.push_back(-1);
                spec_divide.arg_positions.push_back(1);

                Operator::Specification spec_pow;
                spec_pow.symbol = "^";
                spec_pow.priority = 7;
                spec_pow.n_arg = 2;
                spec_pow.arg_positions.push_back(-1);
                spec_pow.arg_positions.push_back(1);

                Operator::Specification spec_mod;
                spec_mod.symbol = "mod";
                spec_mod.priority = 7;
                spec_mod.n_arg = 2;
                spec_mod.arg_positions.push_back(-1);
                spec_mod.arg_positions.push_back(1);

                Operator::Specification spec_ln;
                spec_ln.symbol = "ln";
                spec_ln.priority = 6;
                spec_ln.n_arg = 1;
                spec_ln.arg_positions.push_back(1);

                Operator::Specification spec_log2;
                spec_log2.symbol = "log2";
                spec_log2.priority = 6;
                spec_log2.n_arg = 1;
                spec_log2.arg_positions.push_back(1);

                Operator::Specification spec_log10;
                spec_log10.symbol = "log";
                spec_log10.priority = 6;
                spec_log10.n_arg = 1;
                spec_log10.arg_positions.push_back(1);

                Operator::Specification spec_sin;
                spec_sin.symbol = "sin";
                spec_sin.priority = 6;
                spec_sin.n_arg = 1;
                spec_sin.arg_positions.push_back(1);

                Operator::Specification spec_cos;
                spec_cos.symbol = "cos";
                spec_cos.priority = 6;
                spec_cos.n_arg = 1;
                spec_cos.arg_positions.push_back(1);

                Operator::Specification spec_tan;
                spec_tan.symbol = "tan";
                spec_tan.priority = 6;
                spec_tan.n_arg = 1;
                spec_tan.arg_positions.push_back(1);

                Operator::Specification spec_cot;
                spec_cot.symbol = "cot";
                spec_cot.priority = 6;
                spec_cot.n_arg = 1;
                spec_cot.arg_positions.push_back(1);

                Operator::Specification spec_sinh;
                spec_sinh.symbol = "sinh";
                spec_sinh.priority = 6;
                spec_sinh.n_arg = 1;
                spec_sinh.arg_positions.push_back(1);

                Operator::Specification spec_cosh;
                spec_cosh.symbol = "cosh";
                spec_cosh.priority = 6;
                spec_cosh.n_arg = 1;
                spec_cosh.arg_positions.push_back(1);

                Operator::Specification spec_tanh;
                spec_tanh.symbol = "tanh";
                spec_tanh.priority = 6;
                spec_tanh.n_arg = 1;
                spec_tanh.arg_positions.push_back(1);

                Operator::Specification spec_asin;
                spec_asin.symbol = "arcsin";
                spec_asin.priority = 6;
                spec_asin.n_arg = 1;
                spec_asin.arg_positions.push_back(1);

                Operator::Specification spec_acos;
                spec_acos.symbol = "arccos";
                spec_acos.priority = 6;
                spec_acos.n_arg = 1;
                spec_acos.arg_positions.push_back(1);

                Operator::Specification spec_atan;
                spec_atan.symbol = "arctan";
                spec_atan.priority = 6;
                spec_atan.n_arg = 1;
                spec_atan.arg_positions.push_back(1);

                Operator::Specification spec_asinh;
                spec_asinh.symbol = "arcsinh";
                spec_asinh.priority = 6;
                spec_asinh.n_arg = 1;
                spec_asinh.arg_positions.push_back(1);

                Operator::Specification spec_acosh;
                spec_acosh.symbol = "arccosh";
                spec_acosh.priority = 6;
                spec_acosh.n_arg = 1;
                spec_acosh.arg_positions.push_back(1);

                Operator::Specification spec_atanh;
                spec_atanh.symbol = "arctanh";
                spec_atanh.priority = 6;
                spec_atanh.n_arg = 1;
                spec_atanh.arg_positions.push_back(1);

                Operator::Specification spec_round;
                spec_round.symbol = "round";
                spec_round.priority = 6;
                spec_round.n_arg = 1;
                spec_round.arg_positions.push_back(1);

                Operator::Specification spec_floor;
                spec_floor.symbol = "floor";
                spec_floor.priority = 6;
                spec_floor.n_arg = 1;
                spec_floor.arg_positions.push_back(1);

                Operator::Specification spec_ceil;
                spec_ceil.symbol = "ceil";
                spec_ceil.priority = 6;
                spec_ceil.n_arg = 1;
                spec_ceil.arg_positions.push_back(1);

                Operator::Specification spec_abs;
                spec_abs.symbol = "abs";
                spec_abs.priority = 6;
                spec_abs.n_arg = 1;
                spec_abs.arg_positions.push_back(1);

                Operator::Specification spec_gamma;
                spec_gamma.symbol = "gamma";
                spec_gamma.priority = 6;
                spec_gamma.n_arg = 1;
                spec_gamma.arg_positions.push_back(1);

                Operator::Specification spec_rand;
                spec_rand.symbol = "rand";
                spec_rand.priority = 6;
                spec_rand.n_arg = 0;
                spec_rand.arg_positions.push_back(1);

                /* Math constants */
                Operator::Specification spec_pi;
                spec_pi.symbol = "pi";
                spec_pi.priority = 5;
                spec_pi.n_arg = 0;

                Operator::Specification spec_e;
                spec_e.symbol = "e";
                spec_e.priority = 5;
                spec_e.n_arg = 0;

                Operator::Specification spec_true;
                spec_true.symbol = "T";
                spec_true.priority = 5;
                spec_true.n_arg = 0;

                Operator::Specification spec_false;
                spec_false.symbol = "F";
                spec_false.priority = 5;
                spec_false.n_arg = 0;
                /* = = = = = = = = */

                Operator::Specification spec_and;
                spec_and.symbol = "and";
                spec_and.priority = 6;
                spec_and.n_arg = 2;
                spec_and.arg_positions.push_back(-1);
                spec_and.arg_positions.push_back(1);

                Operator::Specification spec_or;
                spec_or.symbol = "or";
                spec_or.priority = 6;
                spec_or.n_arg = 2;
                spec_or.arg_positions.push_back(-1);
                spec_or.arg_positions.push_back(1);

                Operator::Specification spec_not;
                spec_not.symbol = "not";
                spec_not.priority = 6;
                spec_not.n_arg = 1;
                spec_not.arg_positions.push_back(1);

                Operator::Specification spec_xor;
                spec_xor.symbol = "xor";
                spec_xor.priority = 6;
                spec_xor.n_arg = 2;
                spec_xor.arg_positions.push_back(-1);
                spec_xor.arg_positions.push_back(1);

                Operator::Specification spec_shiftl;
                spec_shiftl.symbol = "shiftl";
                spec_shiftl.priority = 6;
                spec_shiftl.n_arg = 2;
                spec_shiftl.arg_positions.push_back(-1);
                spec_shiftl.arg_positions.push_back(1);

                Operator::Specification spec_shiftr;
                spec_shiftr.symbol = "shiftr";
                spec_shiftr.priority = 6;
                spec_shiftr.n_arg = 2;
                spec_shiftr.arg_positions.push_back(-1);
                spec_shiftr.arg_positions.push_back(1);

                specification_table->push_back(spec_add);
                specification_table->push_back(spec_subtract);
                specification_table->push_back(spec_multiply);
                specification_table->push_back(spec_divide);
                specification_table->push_back(spec_pow);
                specification_table->push_back(spec_mod);

                specification_table->push_back(spec_ln);
                specification_table->push_back(spec_log2);
                specification_table->push_back(spec_log10);

                specification_table->push_back(spec_sin);
                specification_table->push_back(spec_cos);
                specification_table->push_back(spec_tan);
                specification_table->push_back(spec_cot);

                specification_table->push_back(spec_sinh);
                specification_table->push_back(spec_cosh);
                specification_table->push_back(spec_tanh);
                // specification_table->push_back(spec_coth);

                specification_table->push_back(spec_asin);
                specification_table->push_back(spec_acos);
                specification_table->push_back(spec_atan);
                // specification_table->push_back(spec_acot);

                specification_table->push_back(spec_asinh);
                specification_table->push_back(spec_acosh);
                specification_table->push_back(spec_atanh);
                // specification_table->push_back(spec_acoth);

                specification_table->push_back(spec_round);
                specification_table->push_back(spec_floor);
                specification_table->push_back(spec_ceil);
                specification_table->push_back(spec_abs);
                specification_table->push_back(spec_gamma);
                specification_table->push_back(spec_rand);

                specification_table->push_back(spec_pi);
                specification_table->push_back(spec_e);
                specification_table->push_back(spec_true);
                specification_table->push_back(spec_false);

                specification_table->push_back(spec_and);
                specification_table->push_back(spec_or);
                specification_table->push_back(spec_not);
                specification_table->push_back(spec_xor);
                specification_table->push_back(spec_shiftl);
                specification_table->push_back(spec_shiftr);
            }
            return specification_table;
        }